

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O0

void __thiscall TPZMHMixedMeshControl::CreateHDivPressureMHMMesh(TPZMHMixedMeshControl *this)

{
  int dim_00;
  int iVar1;
  TPZCompMesh *multiphysicsmesh;
  TPZCompMesh **ppTVar2;
  TPZCompMesh *pTVar3;
  TPZGeoMesh *this_00;
  TPZCompMesh *this_01;
  TPZGeoMesh *pTVar4;
  long *in_RDI;
  pair<int,_int> skelmatid;
  TPZManVector<TPZCompMesh_*,_3> meshvector;
  TPZCompMesh *MixedFluxPressureCmesh;
  int dim;
  TPZGeoMesh *gmesh;
  TPZManVector<TPZCompMesh_*,_3> cmeshes;
  TPZMHMixedMeshControl *in_stack_000002b0;
  size_t in_stack_000002f8;
  char *in_stack_00000300;
  TPZGeoMesh *in_stack_fffffffffffffef0;
  int64_t in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  TPZCompMesh *in_stack_ffffffffffffff08;
  TPZManVector<TPZCompMesh_*,_3> *in_stack_ffffffffffffff10;
  pair<int,_int> in_stack_ffffffffffffff58;
  TPZMHMeshControl *in_stack_ffffffffffffff60;
  TPZVec<TPZCompMesh_*> local_40 [2];
  
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            ((TPZManVector<TPZCompMesh_*,_3> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8
            );
  multiphysicsmesh =
       TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3d));
  ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](local_40,0);
  *ppTVar2 = multiphysicsmesh;
  pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 5));
  ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](local_40,1);
  *ppTVar2 = pTVar3;
  if (1 < *(int *)((long)in_RDI + 0x34)) {
    TPZManVector<TPZCompMesh_*,_3>::Resize
              (in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
    pTVar3 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 0x3e))
    ;
    ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](local_40,2);
    *ppTVar2 = pTVar3;
  }
  ppTVar2 = TPZVec<TPZCompMesh_*>::operator[](local_40,0);
  this_00 = TPZCompMesh::Reference(*ppTVar2);
  pTVar4 = this_00;
  if (this_00 == (TPZGeoMesh *)0x0) {
    in_stack_ffffffffffffff08 =
         (TPZCompMesh *)std::operator<<((ostream *)&std::cout,"Geometric mesh doesn\'t exist");
    std::ostream::operator<<(in_stack_ffffffffffffff08,std::endl<char,std::char_traits<char>>);
    pzinternal::DebugStopImpl(in_stack_00000300,in_stack_000002f8);
  }
  dim_00 = TPZGeoMesh::Dimension(this_00);
  iVar1 = dim_00;
  TPZGeoMesh::ResetReference(in_stack_fffffffffffffef0);
  this_01 = TPZAutoPointer<TPZCompMesh>::operator->((TPZAutoPointer<TPZCompMesh> *)(in_RDI + 2));
  pTVar3 = this_01;
  TPZCompMesh::SetDimModel(this_01,dim_00);
  TPZCompMesh::SetAllCreateFunctionsMultiphysicElem((TPZCompMesh *)0x1f5e0b6);
  BuildMultiPhysicsMesh(in_stack_000002b0);
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            ((TPZManVector<TPZCompMesh_*,_3> *)CONCAT44(iVar1,in_stack_ffffffffffffff00),
             (int64_t)pTVar3);
  TPZManVector<TPZCompMesh_*,_3>::operator=
            ((TPZManVector<TPZCompMesh_*,_3> *)CONCAT44(iVar1,in_stack_ffffffffffffff00),
             (TPZManVector<TPZCompMesh_*,_3> *)pTVar3);
  TPZMHMeshControl::JoinSubdomains
            (in_stack_ffffffffffffff60,(TPZVec<TPZCompMesh_*> *)in_stack_ffffffffffffff58,
             multiphysicsmesh);
  TPZBuildMultiphysicsMesh::TransferFromMeshes
            ((TPZVec<TPZCompMesh_*> *)pTVar4,in_stack_ffffffffffffff08);
  std::pair<int,_int>::pair<int_&,_int_&,_true>
            ((pair<int,_int> *)&stack0xffffffffffffff58,(int *)(in_RDI + 7),
             (int *)((long)in_RDI + 0x3c));
  pTVar4 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  iVar1 = TPZGeoMesh::Dimension(pTVar4);
  (**(code **)(*in_RDI + 0xa0))(in_RDI,iVar1 + -1);
  pTVar4 = TPZAutoPointer<TPZGeoMesh>::operator->((TPZAutoPointer<TPZGeoMesh> *)(in_RDI + 1));
  iVar1 = TPZGeoMesh::Dimension(pTVar4);
  (**(code **)(*in_RDI + 0xa0))(in_RDI,iVar1 + -2);
  (**(code **)(*(long *)this_01 + 0x88))();
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector((TPZManVector<TPZCompMesh_*,_3> *)pTVar4);
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector((TPZManVector<TPZCompMesh_*,_3> *)pTVar4);
  return;
}

Assistant:

void TPZMHMixedMeshControl::CreateHDivPressureMHMMesh()
{
    TPZManVector<TPZCompMesh *,3 > cmeshes(2);
    cmeshes[0] = fFluxMesh.operator->();
    cmeshes[1] = fPressureFineMesh.operator->();
    
    if(0)
    {
        std::ofstream out("PressureMesh_MultiPhis.txt");
        cmeshes[1] ->Print(out);
        
        std::ofstream out2("FluxMesh_MultiPhis.txt");
        cmeshes[0] ->Print(out2);
    }
    
    
    if(fNState > 1) {
        cmeshes.Resize(3);
        cmeshes[2] = fRotationMesh.operator->();
    }
    TPZGeoMesh *gmesh = cmeshes[0]->Reference();
    if(!gmesh)
    {
        std::cout<< "Geometric mesh doesn't exist" << std::endl;
        DebugStop();
    }
    int dim = gmesh->Dimension();
    gmesh->ResetReference();
    // Multiphysics mesh
    TPZCompMesh * MixedFluxPressureCmesh = fCMesh.operator->();
    MixedFluxPressureCmesh->SetDimModel(dim);
    MixedFluxPressureCmesh->SetAllCreateFunctionsMultiphysicElem();
    
    BuildMultiPhysicsMesh();
    TPZManVector<TPZCompMesh * ,3> meshvector;
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out2("gmesh.txt");
        gmesh->Print(out2);
        std::ofstream out3("HDivMesh.txt");
        fFluxMesh->Print(out3);
        std::ofstream out4("PressureMesh.txt");
        fPressureFineMesh->Print(out4);
    }
#endif
    
    meshvector = cmeshes;

    // populate the connect to subdomain data structure for the multiphysics mesh
    JoinSubdomains(meshvector, MixedFluxPressureCmesh);
    
    // Transferindo para a multifisica
//    TPZBuildMultiphysicsMesh::AddElements(meshvector, MixedFluxPressureCmesh);
//    TPZBuildMultiphysicsMesh::AddConnects(meshvector, MixedFluxPressureCmesh);
    // copy the solution of the atomic meshes to the multiphysics mesh
    TPZBuildMultiphysicsMesh::TransferFromMeshes(meshvector, MixedFluxPressureCmesh);

    std::pair<int,int> skelmatid(fSkeletonMatId,fSecondSkeletonMatId);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-1);
    CreateMultiPhysicsInterfaceElements(fGMesh->Dimension()-2);
#ifdef PZDEBUG
    if(0)
    {
        MixedFluxPressureCmesh->ComputeNodElCon();
        std::ofstream file("cmeshmphys.vtk");
        TPZVTKGeoMesh::PrintCMeshVTK(MixedFluxPressureCmesh, file,true);
        std::ofstream out("cmeshmphys.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    MixedFluxPressureCmesh->CleanUpUnconnectedNodes();
    
#ifdef PZDEBUG
    if(0)
    {
        std::ofstream out("multiphysics.txt");
        MixedFluxPressureCmesh->Print(out);
    }
#endif
    
    return;
    
}